

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
kratos::generate_verilog_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,kratos *this,Generator *top)

{
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  _Alloc_hider local_38;
  undefined1 local_30 [24];
  bool local_18;
  
  local_68._8_8_ = local_50;
  local_68[0] = true;
  local_68[1] = false;
  local_68._16_8_ = (pointer)0x0;
  local_50[0] = '\0';
  local_50._16_8_ = (pointer)0x50;
  local_38._M_p = local_30 + 8;
  local_30._0_8_ = 0;
  local_30[8] = '\0';
  local_18 = false;
  generate_verilog_abi_cxx11_
            (__return_storage_ptr__,this,(Generator *)local_68,(SystemVerilogCodeGenOptions *)0x0);
  SystemVerilogCodeGenOptions::~SystemVerilogCodeGenOptions((SystemVerilogCodeGenOptions *)local_68)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> generate_verilog(Generator* top) {
    return generate_verilog(top, {});
}